

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_a83014::HandleSubstringCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  size_t name;
  cmExecutionStatus *pcVar1;
  size_type sVar2;
  char *pcVar3;
  cmMakefile *this;
  string local_1b0 [32];
  string_view local_190;
  cmAlphaNum local_180;
  cmAlphaNum local_150;
  string local_120;
  cmAlphaNum local_100;
  cmAlphaNum local_d0;
  string local_a0;
  int local_7c;
  unsigned_long uStack_78;
  int intStringLength;
  size_t stringLength;
  string *variableName;
  int end;
  int begin;
  string *stringValue;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  pcVar1 = local_20;
  if (sVar2 == 5) {
    _end = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)status_local,1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)status_local,2);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    variableName._4_4_ = atoi(pcVar3);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)status_local,3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    variableName._0_4_ = atoi(pcVar3);
    stringLength = (size_t)std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)status_local,4);
    uStack_78 = std::__cxx11::string::size();
    pcVar1 = local_20;
    local_7c = (int)uStack_78;
    if ((variableName._4_4_ < 0) || (local_7c < variableName._4_4_)) {
      cmAlphaNum::cmAlphaNum(&local_d0,"begin index: ");
      cmAlphaNum::cmAlphaNum(&local_100,variableName._4_4_);
      cmStrCat<char[22],unsigned_long>
                (&local_a0,&local_d0,&local_100,(char (*) [22])" is out of range 0 - ",
                 &stack0xffffffffffffff88);
      cmExecutionStatus::SetError(pcVar1,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      args_local._7_1_ = false;
    }
    else if ((int)variableName < -1) {
      cmAlphaNum::cmAlphaNum(&local_150,"end index: ");
      cmAlphaNum::cmAlphaNum(&local_180,(int)variableName);
      cmStrCat<char[25]>(&local_120,&local_150,&local_180,(char (*) [25])" should be -1 or greater")
      ;
      cmExecutionStatus::SetError(pcVar1,&local_120);
      std::__cxx11::string::~string((string *)&local_120);
      args_local._7_1_ = false;
    }
    else {
      this = cmExecutionStatus::GetMakefile(local_20);
      name = stringLength;
      std::__cxx11::string::substr((ulong)local_1b0,(ulong)_end);
      local_190 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_1b0);
      cmMakefile::AddDefinition(this,(string *)name,local_190);
      std::__cxx11::string::~string(local_1b0);
      args_local._7_1_ = true;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"sub-command SUBSTRING requires four arguments.",&local_41);
    cmExecutionStatus::SetError(pcVar1,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = false;
  }
  return args_local._7_1_;
}

Assistant:

bool HandleSubstringCommand(std::vector<std::string> const& args,
                            cmExecutionStatus& status)
{
  if (args.size() != 5) {
    status.SetError("sub-command SUBSTRING requires four arguments.");
    return false;
  }

  const std::string& stringValue = args[1];
  int begin = atoi(args[2].c_str());
  int end = atoi(args[3].c_str());
  const std::string& variableName = args[4];

  size_t stringLength = stringValue.size();
  int intStringLength = static_cast<int>(stringLength);
  if (begin < 0 || begin > intStringLength) {
    status.SetError(
      cmStrCat("begin index: ", begin, " is out of range 0 - ", stringLength));
    return false;
  }
  if (end < -1) {
    status.SetError(cmStrCat("end index: ", end, " should be -1 or greater"));
    return false;
  }

  status.GetMakefile().AddDefinition(variableName,
                                     stringValue.substr(begin, end));
  return true;
}